

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptorProto::EnumDescriptorProto
          (EnumDescriptorProto *this,EnumDescriptorProto *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  EnumOptions *this_01;
  EnumDescriptorProto *from_local;
  EnumDescriptorProto *this_local;
  Container *local_28;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumDescriptorProto_00d60680;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::RepeatedPtrField
            (&this->value_,&from->value_);
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar2);
  bVar1 = has_name(from);
  if (bVar1) {
    psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    internal::ArenaStringPtr::AssignWithDefault(&this->name_,psVar2,(from->name_).ptr_);
  }
  bVar1 = has_options(from);
  if (bVar1) {
    this_01 = (EnumOptions *)operator_new(0x70);
    EnumOptions::EnumOptions(this_01,from->options_);
    this->options_ = this_01;
  }
  else {
    this->options_ = (EnumOptions *)0x0;
  }
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto(const EnumDescriptorProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      value_(from.value_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_options()) {
    options_ = new ::google::protobuf::EnumOptions(*from.options_);
  } else {
    options_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumDescriptorProto)
}